

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTriangleMeshConnected.cpp
# Opt level: O2

bool __thiscall
chrono::geometry::ChTriangleMeshConnected::SplitEdge
          (ChTriangleMeshConnected *this,int itA,int itB,int neA,int neB,int *itA_1,int *itA_2,
          int *itB_1,int *itB_2,
          vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *tri_map,
          vector<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
          *aux_data_double,
          vector<std::vector<int,_std::allocator<int>_>_*,_std::allocator<std::vector<int,_std::allocator<int>_>_*>_>
          *aux_data_int,
          vector<std::vector<bool,_std::allocator<bool>_>_*,_std::allocator<std::vector<bool,_std::allocator<bool>_>_*>_>
          *aux_data_bool,
          vector<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_*,_std::allocator<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_*>_>
          *aux_data_vect)

{
  double dVar1;
  ChTriangleMeshConnected *this_00;
  pointer paVar2;
  undefined8 *puVar3;
  vector<double,_std::allocator<double>_> *this_01;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *this_02;
  vector<int,_std::allocator<int>_> *this_03;
  vector<bool,_std::allocator<bool>_> *this_04;
  bool bVar4;
  ulong uVar5;
  int iVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  size_type sVar13;
  size_type sVar14;
  reference pvVar15;
  pair<int,_int> pVar16;
  pair<int,_int> pVar17;
  pair<int,_int> pVar18;
  reference pvVar19;
  reference pvVar20;
  reference pvVar21;
  reference pvVar22;
  reference pvVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  undefined8 *puVar28;
  ChTriangleMeshConnected *pCVar29;
  long lVar30;
  int iVar31;
  int iVar32;
  long lVar33;
  int iVar34;
  bool bVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  reference rVar39;
  int iVnew;
  int local_160;
  int local_15c;
  ChVector<int> tB_2;
  undefined4 uStack_14c;
  undefined1 local_138 [16];
  ChVector<int> tA_2;
  array<int,_4UL> topo_A_2;
  array<int,_4UL> topo_B_2;
  array<int,_4UL> topo_B_1;
  int local_80;
  undefined1 local_50 [32];
  
  auVar38 = vpbroadcastq_avx512vl();
  local_50 = vpaddq_avx2(auVar38,_DAT_00f4a000);
  iVar9 = neA + 1;
  iVar24 = (neA + 2) % 3 + 1;
  iVar10 = neB + 1;
  iVar25 = iVar9 % 3 + 1;
  iVar26 = (neB + 2) % 3 + 1;
  sVar13 = (size_type)itA;
  local_15c = 0;
  local_160 = 0;
  iVar27 = iVar10 % 3 + 1;
  sVar14 = (size_type)itB;
  for (lVar33 = 0; lVar33 != 4; lVar33 = lVar33 + 1) {
    this_00 = *(ChTriangleMeshConnected **)(local_50 + lVar33 * 8);
    if ((this_00->m_vertices).
        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        (pointer)(((_Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_> *)
                  &this_00->super_ChTriangleMesh)->_M_impl).super__Vector_impl_data._M_start) {
      InterpolateAndInsert(this,(int)lVar33,local_160,local_15c,tB_2.m_data);
    }
    else {
      pCVar29 = this_00;
      pvVar15 = std::vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>::at
                          ((vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_> *
                           )this_00,sVar13);
      pVar17.first = 0;
      pVar17.second = 0;
      pVar16 = GetTriangleEdgeIndexes(pCVar29,pvVar15,neA,false);
      iVar11 = 0;
      if (itB != -1) {
        pCVar29 = this_00;
        pvVar15 = std::vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>::at
                            ((vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                              *)this_00,sVar14);
        pVar17 = GetTriangleEdgeIndexes(pCVar29,pvVar15,neB,false);
        iVar11 = pVar17.second;
      }
      iVar31 = pVar16.first;
      iVar12 = pVar16.second;
      pVar18 = (pair<int,_int>)((ulong)pVar16 >> 0x20);
      if (iVar31 < iVar12) {
        pVar18 = pVar16;
      }
      iVar32 = pVar18.first;
      pVar18 = (pair<int,_int>)((ulong)pVar16 >> 0x20);
      if (iVar12 < iVar31) {
        pVar18 = pVar16;
      }
      iVnew = -1;
      iVar34 = pVar18.first;
      InterpolateAndInsert(this,(int)lVar33,iVar32,iVar34,&iVnew);
      if (lVar33 == 0) {
        local_160 = iVar32;
        local_15c = iVar34;
      }
      *itA_1 = -1;
      *itA_2 = -1;
      *itB_1 = -1;
      *itB_2 = -1;
      pvVar15 = std::vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>::at
                          ((vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_> *
                           )this_00,sVar13);
      local_138._0_8_ = *(undefined8 *)pvVar15->m_data;
      iVar6 = pvVar15->m_data[2];
      if (pvVar15->m_data[2] == iVar32) {
        iVar6 = iVnew;
      }
      local_138._8_8_ = 0;
      pvVar15 = std::vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>::at
                          ((vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_> *
                           )this_00,sVar13);
      tA_2.m_data[0] = pvVar15->m_data[0];
      tA_2.m_data[1] = pvVar15->m_data[1];
      tA_2.m_data[2] = pvVar15->m_data[2];
      if (tA_2.m_data[0] == iVar34) {
        tA_2.m_data[0] = iVnew;
      }
      if (tA_2.m_data[1] == iVar34) {
        tA_2.m_data[1] = iVnew;
      }
      if (tA_2.m_data[2] == iVar34) {
        tA_2.m_data[2] = iVnew;
      }
      auVar36 = vpbroadcastd_avx512vl();
      uVar5 = vpcmpeqd_avx512vl(local_138,auVar36);
      auVar37 = vpbroadcastd_avx512vl();
      bVar35 = (bool)((byte)(uVar5 & 0xf) & 1);
      bVar4 = (bool)((byte)((uVar5 & 0xf) >> 1) & 1);
      pvVar15 = std::vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>::at
                          ((vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_> *
                           )this_00,sVar13);
      *(ulong *)pvVar15->m_data =
           CONCAT44((uint)bVar4 * auVar37._4_4_ |
                    (uint)!bVar4 * (int)((ulong)local_138._0_8_ >> 0x20),
                    (uint)bVar35 * auVar37._0_4_ | (uint)!bVar35 * (int)local_138._0_8_);
      pvVar15->m_data[2] = iVar6;
      *itA_1 = itA;
      std::vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>::push_back
                ((vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_> *)this_00,
                 &tA_2);
      *itA_2 = (int)(((long)(this_00->m_vertices).
                            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start -
                     (long)(((_Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                              *)&this_00->super_ChTriangleMesh)->_M_impl).super__Vector_impl_data.
                           _M_start) / 0xc) + -1;
      if (itB != -1) {
        pvVar15 = std::vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>::at
                            ((vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                              *)this_00,sVar14);
        local_138._0_8_ = *(undefined8 *)pvVar15->m_data;
        iVar6 = pvVar15->m_data[2];
        if (pvVar15->m_data[2] == iVar32) {
          iVar6 = iVnew;
        }
        local_138._8_8_ = 0;
        pvVar15 = std::vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>::at
                            ((vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                              *)this_00,sVar14);
        tB_2.m_data[0] = pvVar15->m_data[0];
        tB_2.m_data[1] = pvVar15->m_data[1];
        tB_2.m_data[2] = pvVar15->m_data[2];
        if (tB_2.m_data[0] == iVar34) {
          tB_2.m_data[0] = iVnew;
        }
        if (tB_2.m_data[1] == iVar34) {
          tB_2.m_data[1] = iVnew;
        }
        if (tB_2.m_data[2] == iVar34) {
          tB_2.m_data[2] = iVnew;
        }
        uVar5 = vpcmpeqd_avx512vl(local_138,auVar36);
        auVar36 = vpbroadcastd_avx512vl();
        bVar35 = (bool)((byte)(uVar5 & 0xf) & 1);
        bVar4 = (bool)((byte)((uVar5 & 0xf) >> 1) & 1);
        pvVar15 = std::vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>::at
                            ((vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                              *)this_00,sVar14);
        *(ulong *)pvVar15->m_data =
             CONCAT44((uint)bVar4 * auVar36._4_4_ |
                      (uint)!bVar4 * (int)((ulong)local_138._0_8_ >> 0x20),
                      (uint)bVar35 * auVar36._0_4_ | (uint)!bVar35 * (int)local_138._0_8_);
        pvVar15->m_data[2] = iVar6;
        *itB_1 = itB;
        std::vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>::push_back
                  ((vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_> *)this_00
                   ,&tB_2);
        *itB_2 = (int)(((long)(this_00->m_vertices).
                              super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start -
                       (long)(((_Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                                *)&this_00->super_ChTriangleMesh)->_M_impl).super__Vector_impl_data.
                             _M_start) / 0xc) + -1;
      }
      if (lVar33 == 0) {
        paVar2 = (tri_map->
                 super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        uVar7 = *(undefined8 *)paVar2[sVar13]._M_elems;
        uVar8 = *(undefined8 *)(paVar2[sVar13]._M_elems + 2);
        tB_2.m_data[0] = (int)uVar7;
        tB_2.m_data[1] = (int)((ulong)uVar7 >> 0x20);
        tB_2.m_data[2] = (int)uVar8;
        uStack_14c = (undefined4)((ulong)uVar8 >> 0x20);
        topo_A_2._M_elems._0_8_ = *(undefined8 *)paVar2[sVar13]._M_elems;
        topo_A_2._M_elems._8_8_ = *(undefined8 *)(paVar2[sVar13]._M_elems + 2);
        tB_2.m_data[iVar9] = *itB_1;
        topo_A_2._M_elems[iVar9] = *itB_2;
        iVar32 = iVar24;
        iVar34 = iVar25;
        if (iVar12 < iVar31) {
          iVar32 = iVar25;
          iVar34 = iVar24;
        }
        tB_2.m_data[iVar32] = *itA_2;
        iVar12 = *itA_1;
        iVar31 = tB_2.m_data[iVar34];
        topo_A_2._M_elems[iVar34] = iVar12;
        iVar32 = topo_A_2._M_elems[iVar32];
        for (lVar30 = 1; lVar30 != 4; lVar30 = lVar30 + 1) {
          if (paVar2[iVar31]._M_elems[lVar30] == itA) {
            paVar2[iVar31]._M_elems[lVar30] = iVar12;
          }
        }
        for (lVar30 = 1; lVar30 != 4; lVar30 = lVar30 + 1) {
          if (paVar2[iVar32]._M_elems[lVar30] == itA) {
            paVar2[iVar32]._M_elems[lVar30] = *itA_2;
          }
        }
        auVar36._4_4_ = tB_2.m_data[1];
        auVar36._0_4_ = tB_2.m_data[0];
        auVar36._8_4_ = tB_2.m_data[2];
        auVar36._12_4_ = uStack_14c;
        *(undefined1 (*) [16])paVar2[sVar13]._M_elems = auVar36;
        std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::push_back
                  (tri_map,&topo_A_2);
        paVar2 = (tri_map->
                 super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        topo_A_2._M_elems[0] =
             (int)((ulong)((long)(tri_map->
                                 super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish - (long)paVar2) >> 4) +
             -1;
        if (itB != -1) {
          local_80 = pVar17.first;
          topo_B_1._M_elems._0_8_ = *(undefined8 *)paVar2[sVar14]._M_elems;
          topo_B_1._M_elems._8_8_ = *(undefined8 *)(paVar2[sVar14]._M_elems + 2);
          topo_B_2._M_elems._0_8_ = *(undefined8 *)paVar2[sVar14]._M_elems;
          topo_B_2._M_elems._8_8_ = *(undefined8 *)(paVar2[sVar14]._M_elems + 2);
          topo_B_1._M_elems[iVar10] = *itA_1;
          topo_B_2._M_elems[iVar10] = *itA_2;
          iVar12 = iVar26;
          iVar31 = iVar27;
          if (iVar11 < local_80) {
            iVar12 = iVar27;
            iVar31 = iVar26;
          }
          topo_B_1._M_elems[iVar12] = *itB_2;
          iVar11 = *itB_1;
          iVar32 = topo_B_1._M_elems[iVar31];
          topo_B_2._M_elems[iVar31] = iVar11;
          iVar12 = topo_B_2._M_elems[iVar12];
          for (lVar30 = 1; lVar30 != 4; lVar30 = lVar30 + 1) {
            if (paVar2[iVar32]._M_elems[lVar30] == itB) {
              paVar2[iVar32]._M_elems[lVar30] = iVar11;
            }
          }
          for (lVar30 = 1; lVar30 != 4; lVar30 = lVar30 + 1) {
            if (paVar2[iVar12]._M_elems[lVar30] == itB) {
              paVar2[iVar12]._M_elems[lVar30] = *itB_2;
            }
          }
          auVar37._8_4_ = topo_B_1._M_elems[2];
          auVar37._12_4_ = topo_B_1._M_elems[3];
          auVar37._0_4_ = topo_B_1._M_elems[0];
          auVar37._4_4_ = topo_B_1._M_elems[1];
          *(undefined1 (*) [16])paVar2[sVar14]._M_elems = auVar37;
          std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::push_back
                    (tri_map,&topo_B_2);
        }
      }
    }
  }
  sVar13 = (size_type)local_160;
  sVar14 = (size_type)local_15c;
  puVar3 = *(undefined8 **)(aux_data_double + 8);
  for (puVar28 = *(undefined8 **)aux_data_double; puVar28 != puVar3; puVar28 = puVar28 + 1) {
    this_01 = (vector<double,_std::allocator<double>_> *)*puVar28;
    pvVar19 = std::vector<double,_std::allocator<double>_>::at(this_01,sVar13);
    dVar1 = *pvVar19;
    pvVar19 = std::vector<double,_std::allocator<double>_>::at(this_01,sVar14);
    tB_2.m_data._0_8_ = (dVar1 + *pvVar19) * 0.5;
    std::vector<double,_std::allocator<double>_>::push_back(this_01,(value_type_conflict1 *)&tB_2);
  }
  puVar3 = *(undefined8 **)(aux_data_vect + 8);
  for (puVar28 = *(undefined8 **)aux_data_vect; puVar28 != puVar3; puVar28 = puVar28 + 1) {
    this_02 = (vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *)
              *puVar28;
    pvVar20 = std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::at
                        (this_02,sVar13);
    pvVar21 = std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::at
                        (this_02,sVar14);
    tB_2.m_data._0_8_ = (pvVar20->m_data[0] + pvVar21->m_data[0]) * 0.5;
    tB_2.m_data[2] = SUB84((pvVar20->m_data[1] + pvVar21->m_data[1]) * 0.5,0);
    std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::push_back
              (this_02,(value_type *)&tB_2);
  }
  puVar3 = *(undefined8 **)(aux_data_int + 8);
  for (puVar28 = *(undefined8 **)aux_data_int; puVar28 != puVar3; puVar28 = puVar28 + 1) {
    this_03 = (vector<int,_std::allocator<int>_> *)*puVar28;
    pvVar22 = std::vector<int,_std::allocator<int>_>::at(this_03,sVar13);
    pvVar23 = std::vector<int,_std::allocator<int>_>::at(this_03,sVar14);
    tB_2.m_data[0] = *pvVar23;
    if (*pvVar23 < *pvVar22) {
      tB_2.m_data[0] = *pvVar22;
    }
    std::vector<int,_std::allocator<int>_>::push_back(this_03,tB_2.m_data);
  }
  puVar3 = *(undefined8 **)(aux_data_bool + 8);
  for (puVar28 = *(undefined8 **)aux_data_bool; puVar28 != puVar3; puVar28 = puVar28 + 1) {
    this_04 = (vector<bool,_std::allocator<bool>_> *)*puVar28;
    rVar39 = std::vector<bool,_std::allocator<bool>_>::at(this_04,sVar13);
    bVar35 = true;
    if ((*rVar39._M_p & rVar39._M_mask) == 0) {
      rVar39 = std::vector<bool,_std::allocator<bool>_>::at(this_04,sVar14);
      bVar35 = (*rVar39._M_p & rVar39._M_mask) != 0;
    }
    std::vector<bool,_std::allocator<bool>_>::push_back(this_04,bVar35);
  }
  return true;
}

Assistant:

bool ChTriangleMeshConnected::SplitEdge(
    int itA,                                              // triangle index,
    int itB,                                              // triangle index, -1 if not existing (means free edge on A)
    int neA,                                              // n.edge on tri A: 0,1,2
    int neB,                                              // n.edge on tri B: 0,1,2
    int& itA_1,                                           // returns the index of split triangle A, part1
    int& itA_2,                                           // returns the index of split triangle A, part2
    int& itB_1,                                           // returns the index of split triangle B, part1
    int& itB_2,                                           // returns the index of split triangle B, part2
    std::vector<std::array<int, 4>>& tri_map,             // triangle neighboring map
    std::vector<std::vector<double>*>& aux_data_double,   // auxiliary buffers to interpolate
    std::vector<std::vector<int>*>& aux_data_int,         // auxiliary buffers to interpolate
    std::vector<std::vector<bool>*>& aux_data_bool,       // auxiliary buffers to interpolate
    std::vector<std::vector<ChVector<>>*>& aux_data_vect  // auxiliary buffers to interpolate
) {
    std::array<std::vector<ChVector<int>>*, 4> face_indexes{
        &m_face_v_indices,   //
        &m_face_n_indices,   //
        &m_face_uv_indices,  //
        &m_face_col_indices  //
    };

    int iea = 0;
    int ieb = 0;

    for (int ibuffer = 0; ibuffer < 4; ++ibuffer) {
        if (face_indexes[ibuffer]->size()) {
            // case where one used normals, uv, color buffers, with custom face indexes:
            std::pair<int, int> eA;
            eA = ChTriangleMeshConnected::GetTriangleEdgeIndexes(face_indexes[ibuffer]->at(itA), neA, false);
            std::pair<int, int> eAB = eA;
            std::pair<int, int> eB;
            if (itB != -1)
                eB = ChTriangleMeshConnected::GetTriangleEdgeIndexes(face_indexes[ibuffer]->at(itB), neB, false);
            bool swapA = false;
            if (eA.first > eA.second) {
                swapA = true;
                eAB = {eA.second, eA.first};
            }
            bool swapB = false;
            if (eB.first > eB.second)
                swapB = true;

            // average new vertex/property and add it
            int iVnew = -1;
            InterpolateAndInsert(*this, ibuffer, eAB.first, eAB.second, iVnew);

            if (ibuffer == 0) {
                iea = eAB.first;
                ieb = eAB.second;
            }

            itA_1 = -1;
            itA_2 = -1;
            itB_1 = -1;
            itB_2 = -1;

            // Split triangle A in two (reuse existing, and allocate one new)
            ChVector<int> tA_1 = face_indexes[ibuffer]->at(itA);
            if (tA_1.x() == eAB.first)
                tA_1.x() = iVnew;
            if (tA_1.y() == eAB.first)
                tA_1.y() = iVnew;
            if (tA_1.z() == eAB.first)
                tA_1.z() = iVnew;
            ChVector<int> tA_2 = face_indexes[ibuffer]->at(itA);
            if (tA_2.x() == eAB.second)
                tA_2.x() = iVnew;
            if (tA_2.y() == eAB.second)
                tA_2.y() = iVnew;
            if (tA_2.z() == eAB.second)
                tA_2.z() = iVnew;
            face_indexes[ibuffer]->at(itA) = tA_1;  // reuse face
            itA_1 = itA;
            face_indexes[ibuffer]->push_back(tA_2);  // allocate new face
            itA_2 = (int)face_indexes[ibuffer]->size() - 1;

            // Split triangle B in two (reuse existing, and allocate one new)
            if (itB != -1) {
                ChVector<int> tB_1 = face_indexes[ibuffer]->at(itB);
                if (tB_1.x() == eAB.first)
                    tB_1.x() = iVnew;
                if (tB_1.y() == eAB.first)
                    tB_1.y() = iVnew;
                if (tB_1.z() == eAB.first)
                    tB_1.z() = iVnew;
                ChVector<int> tB_2 = face_indexes[ibuffer]->at(itB);
                if (tB_2.x() == eAB.second)
                    tB_2.x() = iVnew;
                if (tB_2.y() == eAB.second)
                    tB_2.y() = iVnew;
                if (tB_2.z() == eAB.second)
                    tB_2.z() = iVnew;
                face_indexes[ibuffer]->at(itB) = tB_1;  // reuse face
                itB_1 = itB;
                face_indexes[ibuffer]->push_back(tB_2);  // allocate new face
                itB_2 = (int)face_indexes[ibuffer]->size() - 1;
            }

            // for m_face_v_indices buffer (vertex indexes) only:
            if (ibuffer == 0) {
                // Update triangle neighboring map

                std::array<int, 4> topo_A_1 = tri_map[itA];
                std::array<int, 4> topo_A_2 = tri_map[itA];
                topo_A_1[1 + neA] = itB_1;
                topo_A_2[1 + neA] = itB_2;
                int is1 = 1 + ((neA + 2) % 3);
                int is2 = 1 + ((neA + 1) % 3);
                if (swapA)
                    std::swap(is1, is2);
                topo_A_1[is1] = itA_2;
                topo_A_2[is2] = itA_1;
                int itD = topo_A_1[is2];
                int itC = topo_A_2[is1];
                for (int in = 1; in < 4; ++in)
                    if (tri_map[itD][in] == itA)
                        tri_map[itD][in] = itA_1;  // not needed?
                for (int in = 1; in < 4; ++in)
                    if (tri_map[itC][in] == itA)
                        tri_map[itC][in] = itA_2;
                tri_map[itA] = topo_A_1;      // reuse
                tri_map.push_back(topo_A_2);  // allocate
                topo_A_2[0] = (int)tri_map.size() - 1;

                if (itB != -1) {
                    std::array<int, 4> topo_B_1 = tri_map[itB];
                    std::array<int, 4> topo_B_2 = tri_map[itB];
                    topo_B_1[1 + neB] = itA_1;
                    topo_B_2[1 + neB] = itA_2;
                    is1 = 1 + ((neB + 2) % 3);
                    is2 = 1 + ((neB + 1) % 3);
                    if (swapB)
                        std::swap(is1, is2);
                    topo_B_1[is1] = itB_2;
                    topo_B_2[is2] = itB_1;
                    int itF = topo_B_1[is2];
                    int itE = topo_B_2[is1];
                    for (int in = 1; in < 4; ++in)
                        if (tri_map[itF][in] == itB)
                            tri_map[itF][in] = itB_1;  // not needed?
                    for (int in = 1; in < 4; ++in)
                        if (tri_map[itE][in] == itB)
                            tri_map[itE][in] = itB_2;
                    tri_map[itB] = topo_B_1;      // reuse
                    tri_map.push_back(topo_B_2);  // allocate
                    topo_B_2[0] = (int)tri_map.size() - 1;
                }
            }
        } else {
            // case of n or uv or color buffers without indexes, because assumed matching the vertex pos buffer:
            int iVnew = -1;
            InterpolateAndInsert(*this, ibuffer, iea, ieb, iVnew);
        }

    }  // end loop on buffers

    // just in case the user populated the vector of external auxiliary data buffers,
    // interpolate and store the created value. Assume those have same size of m_vertices
    for (auto data_buffer : aux_data_double) {
        double data = (data_buffer->at(iea) + data_buffer->at(ieb)) * 0.5;
        data_buffer->push_back(data);
    }
    for (auto data_buffer : aux_data_vect) {
        ChVector<> data = (data_buffer->at(iea) + data_buffer->at(ieb)) * 0.5;
        data_buffer->push_back(data);
    }
    for (auto data_buffer : aux_data_int) {
        int data = std::max(data_buffer->at(iea), data_buffer->at(ieb));
        data_buffer->push_back(data);
    }
    for (auto data_buffer : aux_data_bool) {
        bool data = data_buffer->at(iea) || data_buffer->at(ieb);
        data_buffer->push_back(data);
    }

    return true;
}